

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_tmpfile(lua_State *L)

{
  LStream *pLVar1;
  FILE *pFVar2;
  int local_1c;
  LStream *p;
  lua_State *L_local;
  
  pLVar1 = newfile(L);
  pFVar2 = tmpfile64();
  pLVar1->f = (FILE *)pFVar2;
  if (pLVar1->f == (FILE *)0x0) {
    local_1c = luaL_fileresult(L,0,(char *)0x0);
  }
  else {
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

static int io_tmpfile(lua_State *L) {
    LStream *p = newfile(L);
    p->f = tmpfile();
    return (p->f == NULL) ? luaL_fileresult(L, 0, NULL) : 1;
}